

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

bool r_exec::dis(Context *context,uint16_t *index)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  Atom *pAVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  double dVar14;
  Atom local_50 [4];
  Atom local_4c [4];
  undefined8 local_48;
  long *plVar4;
  
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  cVar1 = r_code::Atom::isFloat();
  if (cVar1 == '\0') {
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x39) {
      (**(code **)(*plVar6 + 0x20))(plVar6,0);
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x39) {
        pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
        lVar8 = r_code::Utils::GetTimestamp(pAVar7);
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        lVar9 = r_code::Utils::GetTimestamp(pAVar7);
        lVar8 = lVar8 - lVar9;
        auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = 0x45300000;
        dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
        uVar10 = (ulong)dVar14;
        uVar2 = _Context::setTimestampResult
                          (context->implementation,
                           (long)(dVar14 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10);
        *index = uVar2;
        goto LAB_0018f2bf;
      }
    }
  }
  else {
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar1 = r_code::Atom::isFloat();
    if (cVar1 != '\0') {
      (**(code **)(*plVar5 + 0x20))(plVar5,0);
      local_48 = r_code::Atom::asFloat();
      (**(code **)(*plVar6 + 0x20))(plVar6,0);
      fVar12 = (float)r_code::Atom::asFloat();
      r_code::Atom::Float(ABS((float)local_48 - fVar12));
      uVar2 = Context::setAtomicResult(context,local_4c);
      *index = uVar2;
      r_code::Atom::~Atom(local_4c);
LAB_0018f2bf:
      bVar11 = true;
      goto LAB_0018f2eb;
    }
  }
  r_code::Atom::Nil();
  uVar2 = Context::setAtomicResult(context,local_50);
  *index = uVar2;
  r_code::Atom::~Atom(local_50);
  bVar11 = false;
LAB_0018f2eb:
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  return bVar11;
}

Assistant:

bool dis(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            index = context.setAtomicResult(Atom::Float(fabs(lhs[0].asFloat() - rhs[0].asFloat())));
            return true;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            uint64_t lhs_t = Utils::GetTimestamp(&lhs[0]);
            uint64_t rhs_t = Utils::GetTimestamp(&rhs[0]);
            index = context.setTimestampResult(fabs((double)(lhs_t - rhs_t)));
            return true;
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}